

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O0

RealType __thiscall
OpenMD::InteractionManager::getSuggestedCutoffRadius(InteractionManager *this,int *atid)

{
  bool bVar1;
  reference pvVar2;
  _Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> *this_00;
  double *pdVar3;
  int *in_RSI;
  long in_RDI;
  pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> pVar4;
  RealType cutoff;
  iterator it;
  AtomType *atype;
  InteractionManager *in_stack_00000cc0;
  set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>
  *in_stack_ffffffffffffff98;
  AtomType *local_50;
  AtomType *local_48;
  double local_40;
  _Self local_38;
  _Base_ptr local_30;
  key_type *in_stack_ffffffffffffffd8;
  double dVar5;
  _Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000cc0);
  }
  std::
  map<int,_OpenMD::AtomType_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::AtomType_*>_>_>
  ::operator[]((map<int,_OpenMD::AtomType_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::AtomType_*>_>_>
                *)in_stack_ffffffffffffffe0._M_node,in_stack_ffffffffffffffd8);
  std::_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_>::
  _Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> *)
             &stack0xffffffffffffffe0);
  dVar5 = 0.0;
  pvVar2 = std::
           vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                         *)(in_RDI + 0xf8),(long)*in_RSI);
  std::
  vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
  ::operator[](pvVar2,(long)*in_RSI);
  local_30 = (_Base_ptr)
             std::
             set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>
             ::begin(in_stack_ffffffffffffff98);
  while( true ) {
    pvVar2 = std::
             vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                           *)(in_RDI + 0xf8),(long)*in_RSI);
    std::
    vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
    ::operator[](pvVar2,(long)*in_RSI);
    local_38._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_38);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_>::operator*
              ((_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> *)0x2e324e);
    this_00 = (_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> *)
              std::
              __shared_ptr_access<OpenMD::NonBondedInteraction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<OpenMD::NonBondedInteraction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e3256);
    pVar4 = std::make_pair<OpenMD::AtomType*&,OpenMD::AtomType*&>
                      ((AtomType **)this_00,(AtomType **)in_stack_ffffffffffffff98);
    local_50 = pVar4.first;
    local_48 = pVar4.second;
    local_40 = (double)(*(code *)this_00->_M_node[1]._M_parent)(this_00,local_50,local_48);
    pdVar3 = std::max<double>((double *)&stack0xffffffffffffffd8,&local_40);
    dVar5 = *pdVar3;
    std::_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_>::operator++
              (this_00);
  }
  return dVar5;
}

Assistant:

RealType InteractionManager::getSuggestedCutoffRadius(int* atid) {
    if (!initialized_) initialize();

    AtomType* atype = typeMap_[*atid];

    set<NonBondedInteractionPtr>::iterator it;
    RealType cutoff = 0.0;

    for (it = interactions_[*atid][*atid].begin();
         it != interactions_[*atid][*atid].end(); ++it) {
      cutoff =
          max(cutoff, (*it)->getSuggestedCutoffRadius(make_pair(atype, atype)));
    }
    return cutoff;
  }